

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O2

void Cec_ManPatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vPat)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  Gia_ManIncrementTravId(p);
  iVar4 = 0;
  while( true ) {
    if (vPat->nSize <= iVar4) {
      iVar4 = Cec_ManPatComputePattern3_rec
                        (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff));
      if ((iVar4 != 3) && (((*(uint *)pObj >> 0x1d & 1) != 0) + 1 != iVar4)) {
        return;
      }
      Abc_Print((int)p,"Cec_ManPatVerifyPattern(): Verification failed.\n");
      __assert_fail("Value == GIA_ONE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecPat.c"
                    ,0x12f,"void Cec_ManPatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar2 = Vec_IntEntry(vPat,iVar4);
    iVar2 = Abc_Lit2Var(iVar2);
    uVar3 = Vec_IntEntry(p->vCis,iVar2);
    if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) break;
    pGVar1 = p->pObjs;
    *(ulong *)(pGVar1 + uVar3) =
         (*(ulong *)(pGVar1 + uVar3) >> 0x20 & 0x40000000 |
         *(ulong *)(pGVar1 + uVar3) & 0xffffffffbfffffff) ^ 0x40000000;
    Gia_ObjSetTravIdCurrent(p,pGVar1 + uVar3);
    iVar4 = iVar4 + 1;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Cec_ManPatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vPat )
{
    Gia_Obj_t * pTemp;
    int i, Value;
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vPat, Value, i )
    {
        pTemp = Gia_ManCi( p, Abc_Lit2Var(Value) );
//        assert( Abc_LitIsCompl(Value) != (int)pTemp->fMark1 );
        if ( pTemp->fMark1 )
        {
            pTemp->fMark0 = 0;
            pTemp->fMark1 = 1;
        }
        else
        {
            pTemp->fMark0 = 1;
            pTemp->fMark1 = 0;
        }
        Gia_ObjSetTravIdCurrent( p, pTemp );
    }
    Value = Cec_ManPatComputePattern3_rec( p, Gia_ObjFanin0(pObj) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pObj) );
    if ( Value != GIA_ONE )
        Abc_Print( 1, "Cec_ManPatVerifyPattern(): Verification failed.\n" );
    assert( Value == GIA_ONE );
}